

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O2

void __thiscall re2c::CpgotoTable::emit(CpgotoTable *this,OutputFile *o,uint32_t ind)

{
  uint32_t uVar1;
  uint32_t uVar2;
  OutputFile *pOVar3;
  opt_t *poVar4;
  long lVar5;
  string local_50;
  
  pOVar3 = OutputFile::wind(o,ind);
  pOVar3 = OutputFile::ws(pOVar3,"static void *");
  poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
  pOVar3 = OutputFile::wstring(pOVar3,&poVar4->yytarget);
  OutputFile::ws(pOVar3,"[256] = {\n");
  OutputFile::wind(o,ind + 1);
  local_50._M_dataplus._M_p._0_4_ = max_label(this);
  uVar1 = label_t::width((label_t *)&local_50);
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    pOVar3 = OutputFile::ws(o,"&&");
    poVar4 = realopt_t::operator->((realopt_t *)&DAT_00166888);
    pOVar3 = OutputFile::wstring(pOVar3,&poVar4->labelPrefix);
    OutputFile::wlabel(pOVar3,(label_t)(this->table[lVar5]->label).value);
    if (lVar5 == 0xff) {
      OutputFile::ws(o,"\n");
    }
    else if ((~(uint)lVar5 & 7) == 0) {
      pOVar3 = OutputFile::ws(o,",\n");
      OutputFile::wind(pOVar3,ind + 1);
    }
    else {
      uVar2 = label_t::width(&this->table[lVar5]->label);
      pOVar3 = OutputFile::ws(o,",");
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_50,((char)uVar1 + '\x01') - (char)uVar2);
      OutputFile::wstring(pOVar3,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  pOVar3 = OutputFile::wind(o,ind);
  OutputFile::ws(pOVar3,"};\n");
  return;
}

Assistant:

void CpgotoTable::emit (OutputFile & o, uint32_t ind)
{
	o.wind(ind).ws("static void *").wstring(opts->yytarget).ws("[256] = {\n");
	o.wind(++ind);
	const uint32_t max_digits = max_label ().width ();
	for (uint32_t i = 0; i < TABLE_SIZE; ++i)
	{
		o.ws("&&").wstring(opts->labelPrefix).wlabel(table[i]->label);
		if (i == TABLE_SIZE - 1)
		{
			o.ws("\n");
		}
		else if (i % 8 == 7)
		{
			o.ws(",\n").wind(ind);
		}
		else
		{
			const uint32_t padding = max_digits - table[i]->label.width () + 1;
			o.ws(",").wstring(std::string (padding, ' '));
		}
	}
	o.wind(--ind).ws("};\n");
}